

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpathclipper.cpp
# Opt level: O0

void addLineTo(QPainterPath *path,QPointF *point)

{
  bool bVar1;
  int iVar2;
  QPointF *a;
  QPointF *in_RSI;
  long in_FS_OFFSET;
  qreal qVar3;
  Element *middle;
  int elementCount;
  QPointF p;
  QPointF d2;
  QPointF d1;
  QPointF first;
  double in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  Element *in_stack_ffffffffffffff48;
  QPainterPath *in_stack_ffffffffffffff50;
  QPointF *in_stack_ffffffffffffff58;
  int i;
  undefined4 in_stack_ffffffffffffff60;
  QPointF local_88;
  QPointF local_78;
  QPointF local_68;
  QPointF local_58 [2];
  QPointF local_30;
  QPointF local_20;
  int local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = QPainterPath::elementCount
                    ((QPainterPath *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  if (1 < iVar2) {
    QPainterPath::elementAt
              (in_stack_ffffffffffffff50,(int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
    in_stack_ffffffffffffff58 = &local_20;
    if (local_10 == 1) {
      local_30.yp = -NAN;
      local_30.xp = -NAN;
      QPainterPath::elementAt
                (in_stack_ffffffffffffff50,(int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
      local_30 = QPainterPath::Element::operator_cast_to_QPointF(in_stack_ffffffffffffff48);
      local_58[0].yp = -NAN;
      local_58[0].xp = -NAN;
      local_58[0] = operator-((QPointF *)in_stack_ffffffffffffff48,
                              (QPointF *)
                              CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
      local_68.yp = -NAN;
      local_68.xp = -NAN;
      local_78 = QPainterPath::Element::operator_cast_to_QPointF(in_stack_ffffffffffffff48);
      local_68 = operator-((QPointF *)in_stack_ffffffffffffff48,
                           (QPointF *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40))
      ;
      local_88.xp = -NAN;
      local_88.yp = -NAN;
      qVar3 = QPointF::y(local_58);
      a = (QPointF *)((ulong)qVar3 ^ 0x8000000000000000);
      qVar3 = QPointF::x(local_58);
      QPointF::QPointF(&local_88,(qreal)a,qVar3);
      dot(a,(QPointF *)in_stack_ffffffffffffff48);
      bVar1 = qFuzzyIsNull(in_stack_ffffffffffffff38);
      if (bVar1) {
        qVar3 = QPointF::x(in_RSI);
        i = (int)((ulong)in_stack_ffffffffffffff58 >> 0x20);
        QPointF::y(in_RSI);
        QPainterPath::setElementPositionAt
                  ((QPainterPath *)CONCAT44(iVar2,in_stack_ffffffffffffff60),i,(qreal)a,qVar3);
        goto LAB_005d6de6;
      }
    }
  }
  QPainterPath::lineTo
            ((QPainterPath *)CONCAT44(iVar2,in_stack_ffffffffffffff60),in_stack_ffffffffffffff58);
LAB_005d6de6:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void addLineTo(QPainterPath &path, const QPointF &point)
{
    const int elementCount = path.elementCount();
    if (elementCount >= 2) {
        const QPainterPath::Element &middle = path.elementAt(elementCount - 1);
        if (middle.type == QPainterPath::LineToElement) {
            const QPointF first = path.elementAt(elementCount - 2);
            const QPointF d1 = point - first;
            const QPointF d2 = middle - first;

            const QPointF p(-d1.y(), d1.x());

            if (qFuzzyIsNull(dot(p, d2))) {
                path.setElementPositionAt(elementCount - 1, point.x(), point.y());
                return;
            }
        }
    }

    path.lineTo(point);
}